

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall ui::anon_unknown_1::PanelAdapter::~PanelAdapter(PanelAdapter *this)

{
  PanelAdapter *this_local;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__PanelAdapter_00218e08;
  std::shared_ptr<ui::PanelBase>::~shared_ptr(&this->panel_);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->title_);
  ftxui::ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

PanelAdapter(Panel panel) : panel_(panel) {
    title_ = Renderer([&](bool focused) {
      auto style = focused ? inverted : nothing;
      return text(panel_->Title()) | style;
    });

    Add(Container::Vertical({
        title_,
        panel_,
    }));
  }